

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O0

uint32_t get_continuations_count
                   (vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                    *ngrams,vector<unsigned_int,_std::allocator<unsigned_int>_> *ngram)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  *in_RDI;
  uint32_t j;
  bool same;
  uint32_t i;
  uint32_t res;
  uint local_20;
  uint local_18;
  uint32_t local_14;
  
  local_14 = 0;
  for (local_18 = 0;
      sVar3 = std::
              vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
              ::size(in_RDI), local_18 < sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::
             vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
             ::operator[](in_RDI,(ulong)local_18);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pvVar4->first);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (sVar5 < sVar3) {
      bVar2 = true;
      for (local_20 = 0;
          sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI),
          local_20 < sVar3; local_20 = local_20 + 1) {
        pvVar4 = std::
                 vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                 ::operator[](in_RDI,(ulong)local_18);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&pvVar4->first,(ulong)local_20);
        vVar1 = *pvVar6;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RSI,(ulong)local_20);
        bVar2 = (bool)(bVar2 & vVar1 == *pvVar6);
      }
      if (bVar2) {
        pvVar4 = std::
                 vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                 ::operator[](in_RDI,(ulong)local_18);
        local_14 = pvVar4->second + local_14;
      }
    }
  }
  return local_14;
}

Assistant:

uint32_t get_continuations_count(vector<pair<vector<uint32_t>, uint32_t>>& ngrams,
                                 vector<uint32_t> ngram) {
    uint32_t res = 0;
    for (uint32_t i = 0; i < ngrams.size(); i++) {
        if (ngrams[i].first.size() > ngram.size()) {
            bool same = true;
            for (uint32_t j = 0; j < ngram.size(); j++)
                same &= ngrams[i].first[j] == ngram[j];
            if (same)
                res += ngrams[i].second;
        }
    }

    return res;
}